

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_attribute *
adios2_define_variable_attribute_array
          (adios2_io *io,char *name,adios2_type type,void *data,size_t size,char *variable_name,
          char *separator)

{
  undefined8 uVar1;
  invalid_argument *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  undefined8 in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined8 in_RDI;
  long in_R8;
  char *in_R9;
  char *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arrayStrings;
  char **char2D;
  AttributeBase *attributeCpp;
  IO *ioCpp;
  adios2_attribute *attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff2e0;
  allocator_type *in_stack_fffffffffffff2f8;
  allocator *paVar5;
  char **in_stack_fffffffffffff300;
  char **in_stack_fffffffffffff308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff310;
  undefined8 in_stack_fffffffffffff318;
  int __val;
  string *in_stack_fffffffffffff388;
  adios2_io *in_stack_fffffffffffff390;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [39];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [39];
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined8 local_118;
  Attribute *local_110;
  undefined8 local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [64];
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  undefined8 local_38;
  char *local_30;
  long local_28;
  undefined8 local_20;
  undefined4 local_14;
  char *local_10;
  undefined8 local_8;
  
  __val = (int)((ulong)in_stack_fffffffffffff318 >> 0x20);
  local_38 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"for adios2_io, in call to adios2_define_attribute",&local_59);
  adios2::helper::CheckForNullptr<adios2_io>(in_stack_fffffffffffff390,in_stack_fffffffffffff388);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"for const void* data, in call to adios2_define_attribute",&local_91);
  adios2::helper::CheckForNullptr<void_const>(in_stack_fffffffffffff390,in_stack_fffffffffffff388);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (local_28 != 0) {
    local_108 = local_8;
    local_110 = (Attribute *)0x0;
    switch(local_14) {
    case 0:
      local_118 = local_20;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x14876a);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const**,void>
                (in_stack_fffffffffffff310,in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                 in_stack_fffffffffffff2f8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x14879e);
      uVar1 = local_108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,local_10,&local_159);
      pbVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x148807);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_130);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,local_30,&local_181);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,in_stack_00000008,&local_1a9);
      local_110 = adios2::core::IO::DefineAttribute<std::__cxx11::string>
                            (uVar1,local_158,pbVar3,sVar4,local_180,local_1a8,0);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffff2e0);
      break;
    case 1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_590,local_10,&local_591);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,local_30,&local_5b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,in_stack_00000008,&local_5e1);
      local_110 = adios2::core::IO::DefineAttribute<float>
                            (local_8,local_590,local_20,local_28,local_5b8,local_5e0,0);
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      std::__cxx11::string::~string(local_590);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
      break;
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,local_10,&local_609);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_630,local_30,&local_631);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_658,in_stack_00000008,&local_659);
      local_110 = adios2::core::IO::DefineAttribute<double>
                            (local_8,local_608,local_20,local_28,local_630,local_658,0);
      std::__cxx11::string::~string(local_658);
      std::allocator<char>::~allocator((allocator<char> *)&local_659);
      std::__cxx11::string::~string(local_630);
      std::allocator<char>::~allocator((allocator<char> *)&local_631);
      std::__cxx11::string::~string(local_608);
      std::allocator<char>::~allocator((allocator<char> *)&local_609);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6f8,local_10,&local_6f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_720,local_30,&local_721);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_748,in_stack_00000008,&local_749);
      local_110 = adios2::core::IO::DefineAttribute<std::complex<float>>
                            (local_8,local_6f8,local_20,local_28,local_720,local_748,0);
      std::__cxx11::string::~string(local_748);
      std::allocator<char>::~allocator((allocator<char> *)&local_749);
      std::__cxx11::string::~string(local_720);
      std::allocator<char>::~allocator((allocator<char> *)&local_721);
      std::__cxx11::string::~string(local_6f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      break;
    case 4:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,local_10,&local_771);
      paVar5 = &local_799;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_798,local_30,paVar5);
      paVar5 = &local_7c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c0,in_stack_00000008,paVar5);
      local_110 = adios2::core::IO::DefineAttribute<std::complex<double>>
                            (local_8,local_770,local_20,local_28,local_798,local_7c0,0);
      std::__cxx11::string::~string(local_7c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
      std::__cxx11::string::~string(local_798);
      std::allocator<char>::~allocator((allocator<char> *)&local_799);
      std::__cxx11::string::~string(local_770);
      std::allocator<char>::~allocator((allocator<char> *)&local_771);
      break;
    case 5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,local_10,&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,local_30,&local_1f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,in_stack_00000008,&local_221);
      local_110 = adios2::core::IO::DefineAttribute<signed_char>
                            (local_8,local_1d0,local_20,local_28,local_1f8,local_220,0);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      break;
    case 6:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_248,local_10,&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,local_30,&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_298,in_stack_00000008,&local_299);
      local_110 = adios2::core::IO::DefineAttribute<short>
                            (local_8,local_248,local_20,local_28,local_270,local_298,0);
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      break;
    case 7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,local_10,&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,local_30,&local_2e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,in_stack_00000008,&local_311);
      local_110 = adios2::core::IO::DefineAttribute<int>
                            (local_8,local_2c0,local_20,local_28,local_2e8,local_310,0);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      break;
    case 8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,local_10,&local_339);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,local_30,&local_361);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,in_stack_00000008,&local_389);
      local_110 = adios2::core::IO::DefineAttribute<long>
                            (local_8,local_338,local_20,local_28,local_360,local_388,0);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      break;
    case 9:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b0,local_10,&local_3b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d8,local_30,&local_3d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,in_stack_00000008,&local_401);
      local_110 = adios2::core::IO::DefineAttribute<unsigned_char>
                            (local_8,local_3b0,local_20,local_28,local_3d8,local_400,0);
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      break;
    case 10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,local_10,&local_429);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_450,local_30,&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,in_stack_00000008,&local_479);
      local_110 = adios2::core::IO::DefineAttribute<unsigned_short>
                            (local_8,local_428,local_20,local_28,local_450,local_478,0);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      break;
    case 0xb:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4a0,local_10,&local_4a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,local_30,&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f0,in_stack_00000008,&local_4f1);
      local_110 = adios2::core::IO::DefineAttribute<unsigned_int>
                            (local_8,local_4a0,local_20,local_28,local_4c8,local_4f0,0);
      std::__cxx11::string::~string(local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      std::__cxx11::string::~string(local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      break;
    case 0xc:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,local_10,&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_540,local_30,&local_541);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_568,in_stack_00000008,&local_569);
      local_110 = adios2::core::IO::DefineAttribute<unsigned_long>
                            (local_8,local_518,local_20,local_28,local_540,local_568,0);
      std::__cxx11::string::~string(local_568);
      std::allocator<char>::~allocator((allocator<char> *)&local_569);
      std::__cxx11::string::~string(local_540);
      std::allocator<char>::~allocator((allocator<char> *)&local_541);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      break;
    case 0xd:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_680,local_10,&local_681);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6a8,local_30,&local_6a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6d0,in_stack_00000008,&local_6d1);
      local_110 = adios2::core::IO::DefineAttribute<long_double>
                            (local_8,local_680,local_20,local_28,local_6a8,local_6d0,0);
      std::__cxx11::string::~string(local_6d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
      std::__cxx11::string::~string(local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
      std::__cxx11::string::~string(local_680);
      std::allocator<char>::~allocator((allocator<char> *)&local_681);
      break;
    default:
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(__val);
      std::operator+((char *)in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0);
      std::operator+(in_stack_fffffffffffff2d8,(char *)in_stack_fffffffffffff2d0);
      std::invalid_argument::invalid_argument(piVar2,local_7e8);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    return (adios2_attribute *)local_110;
  }
  local_fa = 1;
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,local_10,&local_f9);
  std::operator+((char *)in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0);
  std::operator+(in_stack_fffffffffffff2d8,(char *)in_stack_fffffffffffff2d0);
  std::invalid_argument::invalid_argument(piVar2,local_b8);
  local_fa = 0;
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2_attribute *adios2_define_variable_attribute_array(adios2_io *io, const char *name,
                                                         const adios2_type type, const void *data,
                                                         const size_t size,
                                                         const char *variable_name,
                                                         const char *separator)
{
    adios2_attribute *attribute = nullptr;

    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_define_attribute");

        adios2::helper::CheckForNullptr(data,
                                        "for const void* data, in call to adios2_define_attribute");

        if (size == 0)
        {
            throw std::invalid_argument("ERROR: size of attribute array " + std::string(name) +
                                        " can't be 0,  in call to adios2_define_attribute or "
                                        "adios2_define_variable_attribute");
        }

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        adios2::core::AttributeBase *attributeCpp = nullptr;

        switch (type)
        {
        case (adios2_type_string): {
            const char **char2D = reinterpret_cast<const char **>(const_cast<void *>(data));

            std::vector<std::string> arrayStrings(char2D, char2D + size);

            attributeCpp = &ioCpp.DefineAttribute<std::string>(
                name, arrayStrings.data(), arrayStrings.size(), variable_name, separator);
            break;
        }
#define make_case(adios2_type)                                                                     \
    case (adios2_type): {                                                                          \
        attributeCpp = &ioCpp.DefineAttribute(                                                     \
            name, reinterpret_cast<const MapAdios2Type<adios2_type>::Type *>(data), size,          \
            variable_name, separator);                                                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_C_ATTRIBUTE_TYPE_1ARG(make_case)
#undef make_case
        default: {
            throw std::invalid_argument("ERROR: unsupported type " +
                                        std::to_string(static_cast<int>(type)) +
                                        ", see enum adios2_type for acceptable "
                                        "types, in call to "
                                        "adios2_define_attribute_array or "
                                        "adios2_define_variable_attribute_array\n");
        }
        }

        attribute = reinterpret_cast<adios2_attribute *>(attributeCpp);
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_define_attribute_array or "
                                         "adios_define_variable_attribute_array");
    }
    return attribute;
}